

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  ImVec2 *pIVar1;
  int iVar2;
  ImU32 col;
  bool local_c9;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  float local_a4;
  float ellipsis_x;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  float local_78;
  float local_74;
  float text_size_clipped_x;
  float text_width;
  char *text_end_ellipsis;
  undefined4 local_60;
  float ellipsis_width;
  int ellipsis_dot_count;
  float font_size;
  ImFont *font;
  ImVec2 text_size;
  ImGuiContext *g;
  ImVec2 *text_size_if_known_local;
  char *text_end_full_local;
  char *text_local;
  float ellipsis_max_x_local;
  float clip_max_x_local;
  ImVec2 *pos_max_local;
  ImVec2 *pos_min_local;
  ImDrawList *draw_list_local;
  
  text_size = (ImVec2)GImGui;
  text_size_if_known_local = (ImVec2 *)text_end_full;
  if (text_end_full == (char *)0x0) {
    text_size_if_known_local = (ImVec2 *)FindRenderedTextEnd(text,(char *)0x0);
  }
  if (text_size_if_known == (ImVec2 *)0x0) {
    font = (ImFont *)CalcTextSize(text,(char *)text_size_if_known_local,false,0.0);
  }
  else {
    font = *(ImFont **)text_size_if_known;
  }
  if (font._0_4_ <= pos_max->x - pos_min->x) {
    ImVec2::ImVec2(&local_b4,clip_max_x,pos_max->y);
    ImVec2::ImVec2(&local_bc,0.0,0.0);
    RenderTextClippedEx(draw_list,pos_min,&local_b4,text,(char *)text_size_if_known_local,
                        (ImVec2 *)&font,&local_bc,(ImRect *)0x0);
  }
  else {
    _ellipsis_dot_count = draw_list->_Data->Font;
    ellipsis_width = draw_list->_Data->FontSize;
    local_60 = 3;
    text_end_ellipsis._4_4_ = 0x40a00000;
    _text_size_clipped_x = (ImVec2 *)0x0;
    local_74 = ImMax<float>((pos_max->x + -5.0) - pos_min->x,1.0);
    local_80 = ImFont::CalcTextSizeA
                         (_ellipsis_dot_count,ellipsis_width,local_74,0.0,text,
                          (char *)text_size_if_known_local,(char **)&text_size_clipped_x);
    local_78 = local_80.x;
    if (((ImVec2 *)text == _text_size_clipped_x) &&
       (_text_size_clipped_x < text_size_if_known_local)) {
      iVar2 = ImTextCountUtf8BytesFromChar(text,(char *)text_size_if_known_local);
      _text_size_clipped_x = (ImVec2 *)(text + iVar2);
      local_88 = ImFont::CalcTextSizeA
                           (_ellipsis_dot_count,ellipsis_width,3.4028235e+38,0.0,text,
                            (char *)_text_size_clipped_x,(char **)0x0);
      local_78 = local_88.x;
    }
    while( true ) {
      local_c9 = false;
      if (text < _text_size_clipped_x) {
        local_c9 = ImCharIsBlankA(*(char *)((long)&_text_size_clipped_x[-1].y + 3));
      }
      pIVar1 = _text_size_clipped_x;
      if (local_c9 == false) break;
      _text_size_clipped_x = (ImVec2 *)((long)&_text_size_clipped_x[-1].y + 3);
      local_90 = ImFont::CalcTextSizeA
                           (_ellipsis_dot_count,ellipsis_width,3.4028235e+38,0.0,
                            (char *)_text_size_clipped_x,(char *)pIVar1,(char **)0x0);
      local_78 = local_78 - local_90.x;
    }
    ImVec2::ImVec2(&local_98,clip_max_x,pos_max->y);
    pIVar1 = _text_size_clipped_x;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,0.0,0.0);
    RenderTextClippedEx(draw_list,pos_min,&local_98,text,(char *)pIVar1,(ImVec2 *)&font,
                        (ImVec2 *)&stack0xffffffffffffff60,(ImRect *)0x0);
    local_a4 = pos_min->x + local_78 + 1.0;
    if ((local_a4 + 5.0) - 1.0 <= ellipsis_max_x) {
      ImVec2::ImVec2(&local_ac,local_a4,pos_min->y);
      col = GetColorU32(0,1.0);
      RenderPixelEllipsis(draw_list,local_ac,col,3);
    }
  }
  if ((*(byte *)((long)text_size + 0x2f18) & 1) != 0) {
    LogRenderedText(pos_min,text,(char *)text_size_if_known_local);
  }
  return;
}

Assistant:

void    ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        // FIXME-STYLE: RenderPixelEllipsis() style should use actual font data.
        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const int ellipsis_dot_count = 3;
        const float ellipsis_width = (1.0f + 1.0f) * ellipsis_dot_count - 1.0f;
        const char* text_end_ellipsis = NULL;

        float text_width = ImMax((pos_max.x - ellipsis_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));

        const float ellipsis_x = pos_min.x + text_size_clipped_x + 1.0f;
        if (ellipsis_x + ellipsis_width - 1.0f <= ellipsis_max_x)
            RenderPixelEllipsis(draw_list, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_dot_count);
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}